

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_search.c
# Opt level: O0

void get_energy_distribution_finer
               (int16_t *diff,int stride,int bw,int bh,float *hordist,float *verdist)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int in_ECX;
  long lVar5;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  void *in_R8;
  void *in_R9;
  uint *cur_esq_row;
  float e_recip;
  float ver_val;
  float hor_val;
  uint64_t total;
  int16_t *cur_diff_row_1;
  uint *cur_esq_row_2;
  int16_t *cur_diff_row;
  uint *cur_esq_row_1;
  int j;
  int i;
  int esq_sz;
  int esq_h;
  int esq_w;
  int h_shift;
  int w_shift;
  uint esq [256];
  float local_48c;
  ulong local_470;
  int local_444;
  int local_440;
  uint local_428 [256];
  void *local_28;
  void *local_20;
  int local_14;
  int local_10;
  int local_c;
  long local_8;
  
  bVar1 = 8 < in_ECX;
  iVar2 = in_EDX >> (8 < in_EDX);
  iVar3 = in_ECX >> bVar1;
  local_28 = in_R9;
  local_20 = in_R8;
  local_14 = in_ECX;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  memset(local_428,0,(long)(iVar2 * iVar3) << 2);
  if (8 < in_EDX) {
    for (local_440 = 0; local_440 < local_14; local_440 = local_440 + 1) {
      lVar5 = (long)((local_440 >> bVar1) * iVar2);
      lVar4 = local_8 + (long)(local_440 * local_c) * 2;
      for (local_444 = 0; local_444 < local_10; local_444 = local_444 + 2) {
        local_428[lVar5 + (local_444 >> 1)] =
             (int)*(short *)(lVar4 + (long)local_444 * 2) *
             (int)*(short *)(lVar4 + (long)local_444 * 2) +
             (int)*(short *)(lVar4 + (long)(local_444 + 1) * 2) *
             (int)*(short *)(lVar4 + (long)(local_444 + 1) * 2) +
             local_428[lVar5 + (local_444 >> 1)];
      }
    }
  }
  else {
    for (local_440 = 0; local_440 < local_14; local_440 = local_440 + 1) {
      lVar5 = (long)((local_440 >> bVar1) * iVar2);
      lVar4 = local_8 + (long)(local_440 * local_c) * 2;
      for (local_444 = 0; local_444 < local_10; local_444 = local_444 + 1) {
        local_428[lVar5 + local_444] =
             (int)*(short *)(lVar4 + (long)local_444 * 2) *
             (int)*(short *)(lVar4 + (long)local_444 * 2) + local_428[lVar5 + local_444];
      }
    }
  }
  local_470 = 0;
  for (local_440 = 0; local_440 < iVar2 * iVar3; local_440 = local_440 + 1) {
    local_470 = local_428[local_440] + local_470;
  }
  if (local_470 == 0) {
    for (local_444 = 0; local_444 < iVar2 + -1; local_444 = local_444 + 1) {
      *(float *)((long)local_20 + (long)local_444 * 4) = 1.0 / (float)iVar2;
    }
    for (local_440 = 0; local_440 < iVar3 + -1; local_440 = local_440 + 1) {
      *(float *)((long)local_28 + (long)local_440 * 4) = 1.0 / (float)iVar3;
    }
  }
  else {
    local_48c = (float)local_470;
    memset(local_20,0,(long)(iVar2 + -1) << 2);
    memset(local_28,0,(long)(iVar3 + -1) << 2);
    for (local_440 = 0; local_440 < iVar3 + -1; local_440 = local_440 + 1) {
      lVar4 = (long)(local_440 * iVar2);
      for (local_444 = 0; local_444 < iVar2 + -1; local_444 = local_444 + 1) {
        lVar5 = (long)local_444;
        *(float *)((long)local_20 + lVar5 * 4) =
             *(float *)((long)local_20 + lVar5 * 4) + (float)local_428[lVar4 + lVar5];
        *(float *)((long)local_28 + (long)local_440 * 4) =
             (float)local_428[lVar4 + local_444] + *(float *)((long)local_28 + (long)local_440 * 4);
      }
      *(float *)((long)local_28 + (long)local_440 * 4) =
           (float)local_428[lVar4 + local_444] + *(float *)((long)local_28 + (long)local_440 * 4);
    }
    for (local_444 = 0; local_444 < iVar2 + -1; local_444 = local_444 + 1) {
      *(float *)((long)local_20 + (long)local_444 * 4) =
           (float)local_428[(long)(local_440 * iVar2) + (long)local_444] +
           *(float *)((long)local_20 + (long)local_444 * 4);
    }
    for (local_444 = 0; local_444 < iVar2 + -1; local_444 = local_444 + 1) {
      *(float *)((long)local_20 + (long)local_444 * 4) =
           (1.0 / local_48c) * *(float *)((long)local_20 + (long)local_444 * 4);
    }
    for (local_440 = 0; local_440 < iVar3 + -1; local_440 = local_440 + 1) {
      *(float *)((long)local_28 + (long)local_440 * 4) =
           (1.0 / local_48c) * *(float *)((long)local_28 + (long)local_440 * 4);
    }
  }
  return;
}

Assistant:

static inline void get_energy_distribution_finer(const int16_t *diff,
                                                 int stride, int bw, int bh,
                                                 float *hordist,
                                                 float *verdist) {
  // First compute downscaled block energy values (esq); downscale factors
  // are defined by w_shift and h_shift.
  unsigned int esq[256];
  const int w_shift = bw <= 8 ? 0 : 1;
  const int h_shift = bh <= 8 ? 0 : 1;
  const int esq_w = bw >> w_shift;
  const int esq_h = bh >> h_shift;
  const int esq_sz = esq_w * esq_h;
  int i, j;
  memset(esq, 0, esq_sz * sizeof(esq[0]));
  if (w_shift) {
    for (i = 0; i < bh; i++) {
      unsigned int *cur_esq_row = esq + (i >> h_shift) * esq_w;
      const int16_t *cur_diff_row = diff + i * stride;
      for (j = 0; j < bw; j += 2) {
        cur_esq_row[j >> 1] += (cur_diff_row[j] * cur_diff_row[j] +
                                cur_diff_row[j + 1] * cur_diff_row[j + 1]);
      }
    }
  } else {
    for (i = 0; i < bh; i++) {
      unsigned int *cur_esq_row = esq + (i >> h_shift) * esq_w;
      const int16_t *cur_diff_row = diff + i * stride;
      for (j = 0; j < bw; j++) {
        cur_esq_row[j] += cur_diff_row[j] * cur_diff_row[j];
      }
    }
  }

  uint64_t total = 0;
  for (i = 0; i < esq_sz; i++) total += esq[i];

  // Output hordist and verdist arrays are normalized 1D projections of esq
  if (total == 0) {
    float hor_val = 1.0f / esq_w;
    for (j = 0; j < esq_w - 1; j++) hordist[j] = hor_val;
    float ver_val = 1.0f / esq_h;
    for (i = 0; i < esq_h - 1; i++) verdist[i] = ver_val;
    return;
  }

  const float e_recip = 1.0f / (float)total;
  memset(hordist, 0, (esq_w - 1) * sizeof(hordist[0]));
  memset(verdist, 0, (esq_h - 1) * sizeof(verdist[0]));
  const unsigned int *cur_esq_row;
  for (i = 0; i < esq_h - 1; i++) {
    cur_esq_row = esq + i * esq_w;
    for (j = 0; j < esq_w - 1; j++) {
      hordist[j] += (float)cur_esq_row[j];
      verdist[i] += (float)cur_esq_row[j];
    }
    verdist[i] += (float)cur_esq_row[j];
  }
  cur_esq_row = esq + i * esq_w;
  for (j = 0; j < esq_w - 1; j++) hordist[j] += (float)cur_esq_row[j];

  for (j = 0; j < esq_w - 1; j++) hordist[j] *= e_recip;
  for (i = 0; i < esq_h - 1; i++) verdist[i] *= e_recip;
}